

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_KEY * d2i_ECPrivateKey(EC_KEY **key,uchar **in,long len)

{
  uint8_t *puVar1;
  EC_KEY *ret;
  CBS cbs;
  EC_GROUP *group;
  long len_local;
  uint8_t **inp_local;
  EC_KEY **out_local;
  
  cbs.len = 0;
  if ((key != (EC_KEY **)0x0) && (*key != (EC_KEY *)0x0)) {
    cbs.len = (size_t)EC_KEY_get0_group(*key);
  }
  if (len < 0) {
    ERR_put_error(0xf,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x191);
    out_local = (EC_KEY **)0x0;
  }
  else {
    CBS_init((CBS *)&ret,*in,len);
    out_local = (EC_KEY **)EC_KEY_parse_private_key((CBS *)&ret,(EC_GROUP *)cbs.len);
    if ((EC_KEY *)out_local == (EC_KEY *)0x0) {
      out_local = (EC_KEY **)0x0;
    }
    else {
      if (key != (EC_KEY **)0x0) {
        EC_KEY_free(*key);
        *key = (EC_KEY *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *in = puVar1;
    }
  }
  return (EC_KEY *)out_local;
}

Assistant:

EC_KEY *d2i_ECPrivateKey(EC_KEY **out, const uint8_t **inp, long len) {
  // This function treats its |out| parameter differently from other |d2i|
  // functions. If supplied, take the group from |*out|.
  const EC_GROUP *group = NULL;
  if (out != NULL && *out != NULL) {
    group = EC_KEY_get0_group(*out);
  }

  if (len < 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  EC_KEY *ret = EC_KEY_parse_private_key(&cbs, group);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    EC_KEY_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}